

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O1

void __thiscall LargeGapGrayCode::printStatistics(LargeGapGrayCode *this,int bitWidth)

{
  int iVar1;
  LargeGapGrayCode *pLVar2;
  ostream *poVar3;
  long *plVar4;
  LargeGapGrayCode *this_00;
  LargeGapGrayCode *pLVar5;
  int unaff_R12D;
  int iVar6;
  int iVar7;
  int iVar8;
  const_iterator it;
  double dVar9;
  undefined1 local_78 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> runLengths;
  
  this_00 = (LargeGapGrayCode *)local_78;
  runLengths._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  computeRunLengths((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    this_00,this,bitWidth);
  iVar8 = 999;
  pLVar5 = (LargeGapGrayCode *)runLengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while (pLVar5 != (LargeGapGrayCode *)&runLengths) {
    iVar6 = *(int *)&(pLVar5->m_creationMethod).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    if (iVar6 < iVar8) {
      unaff_R12D = *(int *)((long)&(pLVar5->m_creationMethod).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4);
      iVar8 = iVar6;
    }
    pLVar2 = (LargeGapGrayCode *)std::_Rb_tree_increment((_Rb_tree_node_base *)pLVar5);
    this_00 = pLVar5;
    pLVar5 = pLVar2;
  }
  iVar7 = 0;
  pLVar5 = (LargeGapGrayCode *)runLengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  iVar6 = unaff_R12D;
  while (pLVar5 != (LargeGapGrayCode *)&runLengths) {
    iVar1 = *(int *)&(pLVar5->m_creationMethod).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    if (iVar7 < iVar1) {
      iVar6 = *(int *)((long)&(pLVar5->m_creationMethod).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4);
      iVar7 = iVar1;
    }
    pLVar2 = (LargeGapGrayCode *)std::_Rb_tree_increment((_Rb_tree_node_base *)pLVar5);
    this_00 = pLVar5;
    pLVar5 = pLVar2;
  }
  dVar9 = computeGapVariance(this_00,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                      *)local_78);
  *(undefined8 *)(std::__throw_out_of_range_fmt + *(long *)(std::cout + -0x18)) = 5;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,bitWidth);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)(*(long *)(runLengths._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count + 0x20) + -0x20 +
                                       (long)bitWidth * 0x20),
                      *(long *)(*(long *)(runLengths._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + 0x20) + -0x18 + (long)bitWidth * 0x20));
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar7);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,unaff_R12D);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 0xc;
  plVar4 = (long *)std::ostream::operator<<(poVar3,iVar6);
  *(undefined8 *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x10) = 0xe;
  poVar3 = std::ostream::_M_insert<double>(dVar9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_78);
  return;
}

Assistant:

void LargeGapGrayCode::printStatistics(int bitWidth)
{
	std::map<int, int> runLengths = computeRunLengths(bitWidth);
	int minGap, minCount, maxGap, maxCount;
	computeMinGap(runLengths, minGap, minCount);
	computeMaxGap(runLengths, maxGap, maxCount);
	double gapVariance = computeGapVariance(runLengths);
	std::cout 	<< std::setw(5) << bitWidth
			<< std::setw(12) << m_creationMethod[bitWidth-1]
			<< std::setw(12) << minGap
			<< std::setw(12) << maxGap
			<< std::setw(12) << minCount
			<< std::setw(12) << maxCount
			<< std::setw(14) << gapVariance << std::endl;
}